

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  int *len;
  int iVar1;
  int iVar2;
  double in_XMM0_Qa;
  DiyFp DVar3;
  DiyFp Wm;
  DiyFp Wp;
  DiyFp W;
  DiyFp c_mk;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp v;
  DiyFp *this;
  int *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  DiyFp *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  DiyFp *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff9c;
  int *delta;
  int iVar4;
  undefined4 in_stack_ffffffffffffffac;
  DiyFp *in_stack_ffffffffffffffb0;
  DiyFp local_40;
  DiyFp local_30 [3];
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  this = local_30;
  DiyFp::DiyFp(this,in_XMM0_Qa);
  DiyFp::DiyFp(&local_40);
  DiyFp::DiyFp((DiyFp *)&stack0xffffffffffffffb0);
  DiyFp::NormalizedBoundaries
            (in_stack_ffffffffffffff40,
             (DiyFp *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
  DVar3 = GetCachedPower(iVar4,in_stack_ffffffffffffff08);
  len = (int *)DVar3.f;
  iVar1 = DVar3.e;
  delta = len;
  iVar4 = iVar1;
  DiyFp::Normalize(this);
  DVar3 = DiyFp::operator*(in_stack_ffffffffffffff40,
                           (DiyFp *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar2 = DVar3.e;
  DVar3 = DiyFp::operator*(in_stack_ffffffffffffff40,
                           (DiyFp *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  DiyFp::operator*((DiyFp *)DVar3.f,(DiyFp *)CONCAT44(in_stack_ffffffffffffff3c,DVar3.e));
  DigitGen(in_stack_ffffffffffffffb0,(DiyFp *)CONCAT44(in_stack_ffffffffffffffac,iVar4),
           (uint64_t)delta,(char *)CONCAT44(in_stack_ffffffffffffff9c,iVar1),len,
           (int *)CONCAT44(in_stack_ffffffffffffff8c,iVar2));
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}